

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O0

ostream * operator<<(ostream *os,Complex *m)

{
  Complex *pCVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_70;
  allocator local_39;
  string local_38 [32];
  Complex *local_18;
  Complex *m_local;
  ostream *os_local;
  
  local_18 = m;
  m_local = (Complex *)os;
  poVar2 = std::operator<<(os,"Complex{cmd=\'");
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)pCVar1,10,&local_39);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\', cmd_seq=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_18->header).cmd_seq);
  poVar2 = std::operator<<(poVar2,", param=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_18->header).param);
  poVar2 = std::operator<<(poVar2,", payload=\'");
  dto::pretty_payload(&local_70,&local_18->payload);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2,"\'}");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return poVar2;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const dto::Complex &m) {
  return os << "Complex{cmd='" << std::string(m.header.cmd, dto::CMD_TYPE_LEN).c_str() << "', cmd_seq=" << m.header.cmd_seq
            << ", param=" << m.header.param
            << ", payload='"
            << dto::pretty_payload(m.payload) << "'}";
}